

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvode.c
# Opt level: O0

int CVodeRootInit(void *cvode_mem,int nrtfn,CVRootFn g)

{
  sunrealtype *psVar1;
  int *piVar2;
  CVRootFn in_RDX;
  int in_ESI;
  CVodeMem in_RDI;
  int nrt;
  int i;
  CVodeMem cv_mem;
  int local_34;
  int local_2c;
  int local_4;
  
  if (in_RDI == (CVodeMem)0x0) {
    cvProcessError((CVodeMem)0x0,-0x15,0x336,"CVodeRootInit",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvode/cvode.c"
                   ,"cvode_mem = NULL illegal.");
    local_4 = -0x15;
  }
  else {
    local_34 = in_ESI;
    if (in_ESI < 0) {
      local_34 = 0;
    }
    if ((local_34 != in_RDI->cv_nrtfn) && (0 < in_RDI->cv_nrtfn)) {
      free(in_RDI->cv_glo);
      in_RDI->cv_glo = (sunrealtype *)0x0;
      free(in_RDI->cv_ghi);
      in_RDI->cv_ghi = (sunrealtype *)0x0;
      free(in_RDI->cv_grout);
      in_RDI->cv_grout = (sunrealtype *)0x0;
      free(in_RDI->cv_iroots);
      in_RDI->cv_iroots = (int *)0x0;
      free(in_RDI->cv_rootdir);
      in_RDI->cv_rootdir = (int *)0x0;
      free(in_RDI->cv_gactive);
      in_RDI->cv_gactive = (int *)0x0;
      in_RDI->cv_lrw = in_RDI->cv_lrw - (long)(in_RDI->cv_nrtfn * 3);
      in_RDI->cv_liw = in_RDI->cv_liw - (long)(in_RDI->cv_nrtfn * 3);
    }
    if (local_34 == 0) {
      in_RDI->cv_nrtfn = 0;
      in_RDI->cv_gfun = (CVRootFn)0x0;
      local_4 = 0;
    }
    else if (local_34 == in_RDI->cv_nrtfn) {
      if (in_RDX == in_RDI->cv_gfun) {
        local_4 = 0;
      }
      else if (in_RDX == (CVRootFn)0x0) {
        free(in_RDI->cv_glo);
        in_RDI->cv_glo = (sunrealtype *)0x0;
        free(in_RDI->cv_ghi);
        in_RDI->cv_ghi = (sunrealtype *)0x0;
        free(in_RDI->cv_grout);
        in_RDI->cv_grout = (sunrealtype *)0x0;
        free(in_RDI->cv_iroots);
        in_RDI->cv_iroots = (int *)0x0;
        free(in_RDI->cv_rootdir);
        in_RDI->cv_rootdir = (int *)0x0;
        free(in_RDI->cv_gactive);
        in_RDI->cv_gactive = (int *)0x0;
        in_RDI->cv_lrw = in_RDI->cv_lrw - (long)(local_34 * 3);
        in_RDI->cv_liw = in_RDI->cv_liw - (long)(local_34 * 3);
        cvProcessError(in_RDI,-0x16,0x377,"CVodeRootInit",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvode/cvode.c"
                       ,"g = NULL illegal.");
        local_4 = -0x16;
      }
      else {
        in_RDI->cv_gfun = in_RDX;
        local_4 = 0;
      }
    }
    else {
      in_RDI->cv_nrtfn = local_34;
      if (in_RDX == (CVRootFn)0x0) {
        cvProcessError(in_RDI,-0x16,0x388,"CVodeRootInit",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvode/cvode.c"
                       ,"g = NULL illegal.");
        local_4 = -0x16;
      }
      else {
        in_RDI->cv_gfun = in_RDX;
        in_RDI->cv_glo = (sunrealtype *)0x0;
        psVar1 = (sunrealtype *)malloc((long)local_34 << 3);
        in_RDI->cv_glo = psVar1;
        if (in_RDI->cv_glo == (sunrealtype *)0x0) {
          cvProcessError(in_RDI,-0x14,0x393,"CVodeRootInit",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvode/cvode.c"
                         ,"A memory request failed.");
          local_4 = -0x14;
        }
        else {
          in_RDI->cv_ghi = (sunrealtype *)0x0;
          psVar1 = (sunrealtype *)malloc((long)local_34 << 3);
          in_RDI->cv_ghi = psVar1;
          if (in_RDI->cv_ghi == (sunrealtype *)0x0) {
            free(in_RDI->cv_glo);
            in_RDI->cv_glo = (sunrealtype *)0x0;
            cvProcessError(in_RDI,-0x14,0x39e,"CVodeRootInit",
                           "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvode/cvode.c"
                           ,"A memory request failed.");
            local_4 = -0x14;
          }
          else {
            in_RDI->cv_grout = (sunrealtype *)0x0;
            psVar1 = (sunrealtype *)malloc((long)local_34 << 3);
            in_RDI->cv_grout = psVar1;
            if (in_RDI->cv_grout == (sunrealtype *)0x0) {
              free(in_RDI->cv_glo);
              in_RDI->cv_glo = (sunrealtype *)0x0;
              free(in_RDI->cv_ghi);
              in_RDI->cv_ghi = (sunrealtype *)0x0;
              cvProcessError(in_RDI,-0x14,0x3ab,"CVodeRootInit",
                             "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvode/cvode.c"
                             ,"A memory request failed.");
              local_4 = -0x14;
            }
            else {
              in_RDI->cv_iroots = (int *)0x0;
              piVar2 = (int *)malloc((long)local_34 << 2);
              in_RDI->cv_iroots = piVar2;
              if (in_RDI->cv_iroots == (int *)0x0) {
                free(in_RDI->cv_glo);
                in_RDI->cv_glo = (sunrealtype *)0x0;
                free(in_RDI->cv_ghi);
                in_RDI->cv_ghi = (sunrealtype *)0x0;
                free(in_RDI->cv_grout);
                in_RDI->cv_grout = (sunrealtype *)0x0;
                cvProcessError(in_RDI,-0x14,0x3ba,"CVodeRootInit",
                               "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvode/cvode.c"
                               ,"A memory request failed.");
                local_4 = -0x14;
              }
              else {
                in_RDI->cv_rootdir = (int *)0x0;
                piVar2 = (int *)malloc((long)local_34 << 2);
                in_RDI->cv_rootdir = piVar2;
                if (in_RDI->cv_rootdir == (int *)0x0) {
                  free(in_RDI->cv_glo);
                  in_RDI->cv_glo = (sunrealtype *)0x0;
                  free(in_RDI->cv_ghi);
                  in_RDI->cv_ghi = (sunrealtype *)0x0;
                  free(in_RDI->cv_grout);
                  in_RDI->cv_grout = (sunrealtype *)0x0;
                  free(in_RDI->cv_iroots);
                  in_RDI->cv_iroots = (int *)0x0;
                  cvProcessError(in_RDI,-0x14,0x3cb,"CVodeRootInit",
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvode/cvode.c"
                                 ,"A memory request failed.");
                  local_4 = -0x14;
                }
                else {
                  in_RDI->cv_gactive = (int *)0x0;
                  piVar2 = (int *)malloc((long)local_34 << 2);
                  in_RDI->cv_gactive = piVar2;
                  if (in_RDI->cv_gactive == (int *)0x0) {
                    free(in_RDI->cv_glo);
                    in_RDI->cv_glo = (sunrealtype *)0x0;
                    free(in_RDI->cv_ghi);
                    in_RDI->cv_ghi = (sunrealtype *)0x0;
                    free(in_RDI->cv_grout);
                    in_RDI->cv_grout = (sunrealtype *)0x0;
                    free(in_RDI->cv_iroots);
                    in_RDI->cv_iroots = (int *)0x0;
                    free(in_RDI->cv_rootdir);
                    in_RDI->cv_rootdir = (int *)0x0;
                    cvProcessError(in_RDI,-0x14,0x3de,"CVodeRootInit",
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvode/cvode.c"
                                   ,"A memory request failed.");
                    local_4 = -0x14;
                  }
                  else {
                    for (local_2c = 0; local_2c < local_34; local_2c = local_2c + 1) {
                      in_RDI->cv_rootdir[local_2c] = 0;
                    }
                    for (local_2c = 0; local_2c < local_34; local_2c = local_2c + 1) {
                      in_RDI->cv_gactive[local_2c] = 1;
                    }
                    in_RDI->cv_lrw = (long)(local_34 * 3) + in_RDI->cv_lrw;
                    in_RDI->cv_liw = (long)(local_34 * 3) + in_RDI->cv_liw;
                    local_4 = 0;
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return local_4;
}

Assistant:

int CVodeRootInit(void* cvode_mem, int nrtfn, CVRootFn g)
{
  CVodeMem cv_mem;
  int i, nrt;

  /* Check cvode_mem pointer */
  if (cvode_mem == NULL)
  {
    cvProcessError(NULL, CV_MEM_NULL, __LINE__, __func__, __FILE__, MSGCV_NO_MEM);
    return (CV_MEM_NULL);
  }
  cv_mem = (CVodeMem)cvode_mem;

  nrt = (nrtfn < 0) ? 0 : nrtfn;

  /* If rerunning CVodeRootInit() with a different number of root
     functions (changing number of gfun components), then free
     currently held memory resources */
  if ((nrt != cv_mem->cv_nrtfn) && (cv_mem->cv_nrtfn > 0))
  {
    free(cv_mem->cv_glo);
    cv_mem->cv_glo = NULL;
    free(cv_mem->cv_ghi);
    cv_mem->cv_ghi = NULL;
    free(cv_mem->cv_grout);
    cv_mem->cv_grout = NULL;
    free(cv_mem->cv_iroots);
    cv_mem->cv_iroots = NULL;
    free(cv_mem->cv_rootdir);
    cv_mem->cv_rootdir = NULL;
    free(cv_mem->cv_gactive);
    cv_mem->cv_gactive = NULL;

    cv_mem->cv_lrw -= 3 * (cv_mem->cv_nrtfn);
    cv_mem->cv_liw -= 3 * (cv_mem->cv_nrtfn);
  }

  /* If CVodeRootInit() was called with nrtfn == 0, then set cv_nrtfn to
     zero and cv_gfun to NULL before returning */
  if (nrt == 0)
  {
    cv_mem->cv_nrtfn = nrt;
    cv_mem->cv_gfun  = NULL;
    return (CV_SUCCESS);
  }

  /* If rerunning CVodeRootInit() with the same number of root functions
     (not changing number of gfun components), then check if the root
     function argument has changed */
  /* If g != NULL then return as currently reserved memory resources
     will suffice */
  if (nrt == cv_mem->cv_nrtfn)
  {
    if (g != cv_mem->cv_gfun)
    {
      if (g == NULL)
      {
        free(cv_mem->cv_glo);
        cv_mem->cv_glo = NULL;
        free(cv_mem->cv_ghi);
        cv_mem->cv_ghi = NULL;
        free(cv_mem->cv_grout);
        cv_mem->cv_grout = NULL;
        free(cv_mem->cv_iroots);
        cv_mem->cv_iroots = NULL;
        free(cv_mem->cv_rootdir);
        cv_mem->cv_rootdir = NULL;
        free(cv_mem->cv_gactive);
        cv_mem->cv_gactive = NULL;

        cv_mem->cv_lrw -= 3 * nrt;
        cv_mem->cv_liw -= 3 * nrt;

        cvProcessError(cv_mem, CV_ILL_INPUT, __LINE__, __func__, __FILE__,
                       MSGCV_NULL_G);
        return (CV_ILL_INPUT);
      }
      else
      {
        cv_mem->cv_gfun = g;
        return (CV_SUCCESS);
      }
    }
    else { return (CV_SUCCESS); }
  }

  /* Set variable values in CVode memory block */
  cv_mem->cv_nrtfn = nrt;
  if (g == NULL)
  {
    cvProcessError(cv_mem, CV_ILL_INPUT, __LINE__, __func__, __FILE__,
                   MSGCV_NULL_G);
    return (CV_ILL_INPUT);
  }
  else { cv_mem->cv_gfun = g; }

  /* Allocate necessary memory and return */
  cv_mem->cv_glo = NULL;
  cv_mem->cv_glo = (sunrealtype*)malloc(nrt * sizeof(sunrealtype));
  if (cv_mem->cv_glo == NULL)
  {
    cvProcessError(cv_mem, CV_MEM_FAIL, __LINE__, __func__, __FILE__,
                   MSGCV_MEM_FAIL);
    return (CV_MEM_FAIL);
  }

  cv_mem->cv_ghi = NULL;
  cv_mem->cv_ghi = (sunrealtype*)malloc(nrt * sizeof(sunrealtype));
  if (cv_mem->cv_ghi == NULL)
  {
    free(cv_mem->cv_glo);
    cv_mem->cv_glo = NULL;
    cvProcessError(cv_mem, CV_MEM_FAIL, __LINE__, __func__, __FILE__,
                   MSGCV_MEM_FAIL);
    return (CV_MEM_FAIL);
  }

  cv_mem->cv_grout = NULL;
  cv_mem->cv_grout = (sunrealtype*)malloc(nrt * sizeof(sunrealtype));
  if (cv_mem->cv_grout == NULL)
  {
    free(cv_mem->cv_glo);
    cv_mem->cv_glo = NULL;
    free(cv_mem->cv_ghi);
    cv_mem->cv_ghi = NULL;
    cvProcessError(cv_mem, CV_MEM_FAIL, __LINE__, __func__, __FILE__,
                   MSGCV_MEM_FAIL);
    return (CV_MEM_FAIL);
  }

  cv_mem->cv_iroots = NULL;
  cv_mem->cv_iroots = (int*)malloc(nrt * sizeof(int));
  if (cv_mem->cv_iroots == NULL)
  {
    free(cv_mem->cv_glo);
    cv_mem->cv_glo = NULL;
    free(cv_mem->cv_ghi);
    cv_mem->cv_ghi = NULL;
    free(cv_mem->cv_grout);
    cv_mem->cv_grout = NULL;
    cvProcessError(cv_mem, CV_MEM_FAIL, __LINE__, __func__, __FILE__,
                   MSGCV_MEM_FAIL);
    return (CV_MEM_FAIL);
  }

  cv_mem->cv_rootdir = NULL;
  cv_mem->cv_rootdir = (int*)malloc(nrt * sizeof(int));
  if (cv_mem->cv_rootdir == NULL)
  {
    free(cv_mem->cv_glo);
    cv_mem->cv_glo = NULL;
    free(cv_mem->cv_ghi);
    cv_mem->cv_ghi = NULL;
    free(cv_mem->cv_grout);
    cv_mem->cv_grout = NULL;
    free(cv_mem->cv_iroots);
    cv_mem->cv_iroots = NULL;
    cvProcessError(cv_mem, CV_MEM_FAIL, __LINE__, __func__, __FILE__,
                   MSGCV_MEM_FAIL);
    return (CV_MEM_FAIL);
  }

  cv_mem->cv_gactive = NULL;
  cv_mem->cv_gactive = (sunbooleantype*)malloc(nrt * sizeof(sunbooleantype));
  if (cv_mem->cv_gactive == NULL)
  {
    free(cv_mem->cv_glo);
    cv_mem->cv_glo = NULL;
    free(cv_mem->cv_ghi);
    cv_mem->cv_ghi = NULL;
    free(cv_mem->cv_grout);
    cv_mem->cv_grout = NULL;
    free(cv_mem->cv_iroots);
    cv_mem->cv_iroots = NULL;
    free(cv_mem->cv_rootdir);
    cv_mem->cv_rootdir = NULL;
    cvProcessError(cv_mem, CV_MEM_FAIL, __LINE__, __func__, __FILE__,
                   MSGCV_MEM_FAIL);
    return (CV_MEM_FAIL);
  }

  /* Set default values for rootdir (both directions) */
  for (i = 0; i < nrt; i++) { cv_mem->cv_rootdir[i] = 0; }

  /* Set default values for gactive (all active) */
  for (i = 0; i < nrt; i++) { cv_mem->cv_gactive[i] = SUNTRUE; }

  cv_mem->cv_lrw += 3 * nrt;
  cv_mem->cv_liw += 3 * nrt;

  return (CV_SUCCESS);
}